

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::Begin(DeviceContextVkImpl *this,Uint32 ImmediateContextId)

{
  bool bVar1;
  SoftwareQueueIndex CommandQueueId;
  char (*in_RCX) [46];
  string msg;
  string local_40;
  
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == false) {
    FormatString<char[53]>
              (&local_40,(char (*) [53])"Begin() should only be called for deferred contexts.");
    in_RCX = (char (*) [46])0xce;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
               "Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xce);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsRecordingDeferredCommands
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  if (bVar1) {
    FormatString<char[101]>
              (&local_40,
               (char (*) [101])
               "This context is already recording commands. Call FinishCommandList() before beginning new recording."
              );
    in_RCX = (char (*) [46])0xcf;
    DebugAssertionFailed
              ((Char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
               "Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xcf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  local_40._M_dataplus._M_p._0_4_ = ImmediateContextId;
  CommandQueueId.m_Value = StaticCast<unsigned_char,unsigned_int>((uint *)&local_40);
  PrepareCommandPool(this,CommandQueueId);
  local_40._M_dataplus._M_p._0_4_ =
       CONCAT31(local_40._M_dataplus._M_p._1_3_,(char)ImmediateContextId);
  IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
            ((IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *)
             &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DstImmediateContextId,
             (uchar *)&local_40);
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DstImmediateContextId.m_Value !=
      ImmediateContextId) {
    FormatString<char[26],char[46]>
              (&local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DstImmediateContextId == ImmediateContextId",in_RCX);
    DebugAssertionFailed
              ((Char *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
               "Begin",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_40._M_dataplus._M_p._4_4_,(Uint32)local_40._M_dataplus._M_p),
                      local_40.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_pQueryMgr =
       (QueryManagerVk *)
       (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)->m_QueryMgrs).
       super__Vector_base<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>,_std::allocator<std::unique_ptr<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[CommandQueueId.m_Value]._M_t.
       super___uniq_ptr_impl<Diligent::QueryManagerVk,_std::default_delete<Diligent::QueryManagerVk>_>
       ._M_t;
  return;
}

Assistant:

void DeviceContextVkImpl::Begin(Uint32 ImmediateContextId)
{
    DEV_CHECK_ERR(IsDeferred(), "Begin() should only be called for deferred contexts.");
    DEV_CHECK_ERR(!IsRecordingDeferredCommands(), "This context is already recording commands. Call FinishCommandList() before beginning new recording.");
    const SoftwareQueueIndex CommandQueueId{ImmediateContextId};
    PrepareCommandPool(CommandQueueId);
    m_DstImmediateContextId = static_cast<Uint8>(ImmediateContextId);
    VERIFY_EXPR(m_DstImmediateContextId == ImmediateContextId);
    m_pQueryMgr = &m_pDevice->GetQueryMgr(CommandQueueId);
}